

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void set_mb_wiener_var_calc_done(AV1_COMP *cpi)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  int mt_thread_id;
  int mi_row;
  AV1EncRowMultiThreadSync *intra_row_mt_sync;
  AV1EncAllIntraMultiThreadInfo *intra_mt;
  int mt_unit_cols;
  int mt_unit_step;
  int mb_step;
  BLOCK_SIZE bsize;
  CommonModeInfoParams *mi_params;
  int local_38;
  int local_34;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [*(byte *)(in_RDI + 0x13abf)];
  iVar3 = ((int)in_RDI[0x7833] + 8) / 0x10;
  lVar2 = *in_RDI;
  local_38 = 0;
  for (local_34 = 0; local_34 < *(int *)((long)in_RDI + 0x3c194); local_34 = (uint)bVar1 + local_34)
  {
    (*(code *)in_RDI[0x135fe])(lVar2 + 0x14e08,local_38,iVar3 + -1,iVar3);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void set_mb_wiener_var_calc_done(AV1_COMP *const cpi) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const int mb_step = mi_size_wide[bsize];
  assert(MB_WIENER_MT_UNIT_SIZE < BLOCK_SIZES_ALL);
  const int mt_unit_step = mi_size_wide[MB_WIENER_MT_UNIT_SIZE];
  const int mt_unit_cols =
      (mi_params->mi_cols + (mt_unit_step >> 1)) / mt_unit_step;
  const AV1EncAllIntraMultiThreadInfo *const intra_mt = &cpi->mt_info.intra_mt;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;

  // Update the wiener variance computation of every row in the frame to
  // indicate that it is complete in order to avoid dependent workers waiting
  // indefinitely.
  for (int mi_row = 0, mt_thread_id = 0; mi_row < mi_params->mi_rows;
       mi_row += mb_step, ++mt_thread_id) {
    intra_mt->intra_sync_write_ptr(intra_row_mt_sync, mt_thread_id,
                                   mt_unit_cols - 1, mt_unit_cols);
  }
}